

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_concat(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  bson_t *pbVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  undefined8 uVar9;
  ulong uVar10;
  bool bVar11;
  int fd2_1;
  int fd1_1;
  int off_1;
  uint o_1;
  int unequal_1;
  uint8_t *expected_data_1;
  uint8_t *bson_data_1;
  char *expected_json_1;
  char *bson_json_1;
  int fd2;
  int fd1;
  int off;
  uint o;
  int unequal;
  uint8_t *expected_data;
  uint8_t *bson_data;
  char *expected_json;
  char *bson_json;
  bson_t child2;
  bson_t child;
  bson_t expected;
  bson_t bcon;
  uint local_3c0;
  uint local_390;
  uint local_364;
  uint local_360;
  uint local_32c;
  uint local_328;
  bson_t local_300;
  bson_t local_280;
  undefined1 local_200 [4];
  uint local_1fc;
  undefined1 local_180 [4];
  uint local_17c;
  
  bson_init(local_180);
  bson_init(local_200);
  bson_init(&local_280);
  bson_init(&local_300);
  bson_append_utf8(&local_280,"hello",0xffffffff,"world");
  bson_append_document(local_200,"foo",0xffffffff,&local_280);
  uVar3 = bson_bcon_magic();
  pbVar4 = bcon_ensure_const_bson_ptr(&local_280);
  bcon_append(local_180,"foo","{",uVar3,0x15,pbVar4,"}",0);
  pvVar5 = (void *)bson_get_data(local_180);
  pvVar6 = (void *)bson_get_data(local_200);
  local_32c = 0xffffffff;
  bVar11 = true;
  if (local_1fc == local_17c) {
    pvVar7 = (void *)bson_get_data(local_200);
    pvVar8 = (void *)bson_get_data(local_180);
    iVar1 = memcmp(pvVar7,pvVar8,(ulong)local_1fc);
    bVar11 = iVar1 != 0;
  }
  if (!bVar11) {
    bson_reinit(local_180);
    bson_reinit(local_200);
    bson_reinit(&local_280);
    bson_append_utf8(&local_280,"0",0xffffffff,"bar");
    bson_append_utf8(&local_280,"1",0xffffffff,"baz");
    bson_append_array(local_200,"foo",0xffffffff,&local_280);
    bson_append_utf8(&local_300,"0",0xffffffff,"baz");
    uVar3 = bson_bcon_magic();
    pbVar4 = bcon_ensure_const_bson_ptr(&local_300);
    bcon_append(local_180,"foo","[","bar",uVar3,0x15,pbVar4,"]",0);
    pvVar5 = (void *)bson_get_data(local_180);
    pvVar6 = (void *)bson_get_data(local_200);
    local_364 = 0xffffffff;
    bVar11 = true;
    if (local_1fc == local_17c) {
      pvVar7 = (void *)bson_get_data(local_200);
      pvVar8 = (void *)bson_get_data(local_180);
      iVar1 = memcmp(pvVar7,pvVar8,(ulong)local_1fc);
      bVar11 = iVar1 != 0;
    }
    if (!bVar11) {
      bson_destroy(local_180);
      bson_destroy(&local_280);
      bson_destroy(&local_300);
      bson_destroy(local_200);
      return;
    }
    uVar3 = bson_as_canonical_extended_json(local_180,0);
    uVar9 = bson_as_canonical_extended_json(local_200,0);
    local_360 = 0;
    do {
      if (local_17c <= local_360 || local_1fc <= local_360) {
LAB_001454d1:
        if (local_364 == 0xffffffff) {
          if (local_17c < local_1fc) {
            local_3c0 = local_1fc;
          }
          else {
            local_3c0 = local_17c;
          }
          local_364 = local_3c0 - 1;
        }
        fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)local_364,uVar3,uVar9
               );
        iVar1 = open("failure.bad.bson",0x42,0x1a0);
        iVar2 = open("failure.expected.bson",0x42,0x1a0);
        if (iVar1 == -1) {
          fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                  ,0x21c,"test_concat","fd1 != -1");
          abort();
        }
        if (iVar2 == -1) {
          fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                  ,0x21c,"test_concat","fd2 != -1");
          abort();
        }
        uVar10 = write(iVar1,pvVar5,(ulong)local_17c);
        if (local_17c != uVar10) {
          fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                  ,0x21c,"test_concat","(&bcon)->len == bson_write (fd1, bson_data, (&bcon)->len)");
          abort();
        }
        uVar10 = write(iVar2,pvVar6,(ulong)local_1fc);
        if (local_1fc != uVar10) {
          fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                  ,0x21c,"test_concat",
                  "(&expected)->len == bson_write (fd2, expected_data, (&expected)->len)");
          abort();
        }
        close(iVar1);
        close(iVar2);
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x21c,"test_concat","0");
        abort();
      }
      if (*(char *)((long)pvVar5 + (ulong)local_360) != *(char *)((long)pvVar6 + (ulong)local_360))
      {
        local_364 = local_360;
        goto LAB_001454d1;
      }
      local_360 = local_360 + 1;
    } while( true );
  }
  uVar3 = bson_as_canonical_extended_json(local_180,0);
  uVar9 = bson_as_canonical_extended_json(local_200,0);
  local_328 = 0;
  do {
    if (local_17c <= local_328 || local_1fc <= local_328) {
LAB_00144f9c:
      if (local_32c == 0xffffffff) {
        if (local_17c < local_1fc) {
          local_390 = local_1fc;
        }
        else {
          local_390 = local_17c;
        }
        local_32c = local_390 - 1;
      }
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)local_32c,uVar3,uVar9);
      iVar1 = open("failure.bad.bson",0x42,0x1a0);
      iVar2 = open("failure.expected.bson",0x42,0x1a0);
      if (iVar1 == -1) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x20f,"test_concat","fd1 != -1");
        abort();
      }
      if (iVar2 == -1) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x20f,"test_concat","fd2 != -1");
        abort();
      }
      uVar10 = write(iVar1,pvVar5,(ulong)local_17c);
      if (local_17c != uVar10) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x20f,"test_concat","(&bcon)->len == bson_write (fd1, bson_data, (&bcon)->len)");
        abort();
      }
      uVar10 = write(iVar2,pvVar6,(ulong)local_1fc);
      if (local_1fc != uVar10) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
                ,0x20f,"test_concat",
                "(&expected)->len == bson_write (fd2, expected_data, (&expected)->len)");
        abort();
      }
      close(iVar1);
      close(iVar2);
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-basic.c"
              ,0x20f,"test_concat","0");
      abort();
    }
    if (*(char *)((long)pvVar5 + (ulong)local_328) != *(char *)((long)pvVar6 + (ulong)local_328)) {
      local_32c = local_328;
      goto LAB_00144f9c;
    }
    local_328 = local_328 + 1;
  } while( true );
}

Assistant:

static void
test_concat (void)
{
   bson_t bcon, expected, child, child2;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&child);
   bson_init (&child2);

   bson_append_utf8 (&child, "hello", -1, "world", -1);
   bson_append_document (&expected, "foo", -1, &child);

   BCON_APPEND (&bcon, "foo", "{", BCON (&child), "}");

   bson_eq_bson (&bcon, &expected);

   bson_reinit (&bcon);
   bson_reinit (&expected);
   bson_reinit (&child);

   bson_append_utf8 (&child, "0", -1, "bar", -1);
   bson_append_utf8 (&child, "1", -1, "baz", -1);
   bson_append_array (&expected, "foo", -1, &child);

   bson_append_utf8 (&child2, "0", -1, "baz", -1);
   BCON_APPEND (&bcon, "foo", "[", "bar", BCON (&child2), "]");

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&child);
   bson_destroy (&child2);
   bson_destroy (&expected);
}